

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

void __thiscall serial::Serial::SerialImpl::writeUnlock(SerialImpl *this)

{
  IOException *this_00;
  allocator<char> local_39;
  string local_38;
  int local_14;
  SerialImpl *pSStack_10;
  int result;
  SerialImpl *this_local;
  
  pSStack_10 = this;
  local_14 = pthread_mutex_unlock((pthread_mutex_t *)&this->write_mutex);
  if (local_14 != 0) {
    this_00 = (IOException *)__cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
               ,&local_39);
    IOException::IOException(this_00,&local_38,0x426,local_14);
    __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
  }
  return;
}

Assistant:

void
Serial::SerialImpl::writeUnlock ()
{
  int result = pthread_mutex_unlock(&this->write_mutex);
  if (result) {
    THROW (IOException, result);
  }
}